

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

int rtp_rfc3119_pkt_unpack(rtp_pkt_t *pkt)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  
  iVar3 = 0;
  if (((uint)pkt->b & 0xfe00) == 0xc000) {
    bVar4 = pkt->data[(ulong)pkt->hlen - 1] >> 7;
    bVar1 = *(byte *)&pkt->rfc3119_b;
    *(byte *)&pkt->rfc3119_b = bVar1 & 0xfe | bVar4;
    bVar2 = pkt->data[(ulong)pkt->hlen - 1];
    *(byte *)&pkt->rfc3119_b = bVar1 & 0xfc | bVar4 | bVar2 >> 5 & 2;
    iVar3 = 1;
    if ((bVar2 & 0x40) != 0) {
      pkt->length = pkt->length - 1;
    }
  }
  return iVar3;
}

Assistant:

int rtp_rfc3119_pkt_unpack(rtp_pkt_t *pkt) {
  if (pkt->b.pt != RTP_DYN)
    return 0;

  unsigned char *ptr = pkt->data + pkt->hlen - 1;
  pkt->rfc3119_b.c = (*ptr >> 7) & 1;
  assert((pkt->rfc3119_b.c == 0) || "Continuation is not handled yet");
  pkt->rfc3119_b.t = (*ptr >> 6) & 1;

  unsigned short length;
  if (pkt->rfc3119_b.t) {
    length = (*(ptr++) & 0x3F) << 8;
    length |= (*ptr & 0xFF);
    pkt->length--;
  } else {
    length = (*ptr & 0x3F);
  }
  
  assert((pkt->length == length) || "error while decoding RFC3119 length");
  
  return 1;
}